

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::VSliderScalar
               (char *label,ImVec2 *size,ImGuiDataType data_type,void *p_data,void *p_min,
               void *p_max,char *format,ImGuiSliderFlags flags)

{
  ImGuiWindow *this;
  ImDrawList *this_00;
  ImVec2 pos;
  ImVec2 IVar1;
  ImVec2 p_max_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiID id;
  int iVar5;
  ImU32 IVar6;
  ImGuiCol idx;
  float fVar7;
  float fVar8;
  char *local_f8;
  ImRect frame_bb;
  ImRect grab_bb;
  ImVec2 local_98;
  ImVec2 local_90;
  ImRect bb;
  char value_buf [64];
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar7 = IVar1.x;
    frame_bb.Min.x = (this->DC).CursorPos.x;
    frame_bb.Min.y = (this->DC).CursorPos.y;
    frame_bb.Max.x = (*size).x + frame_bb.Min.x;
    frame_bb.Max.y = (*size).y + frame_bb.Min.y;
    fVar8 = 0.0;
    if (0.0 < fVar7) {
      fVar8 = (pIVar2->Style).ItemInnerSpacing.x + fVar7;
    }
    bb.Max.x = fVar8 + frame_bb.Max.x;
    bb.Max.y = frame_bb.Max.y + 0.0;
    bb.Min.x = frame_bb.Min.x;
    bb.Min.y = frame_bb.Min.y;
    ItemSize(&bb,(pIVar2->Style).FramePadding.y);
    bVar4 = false;
    bVar3 = ItemAdd(&frame_bb,id,(ImRect *)0x0,0);
    if (bVar3) {
      if (format == (char *)0x0) {
        local_f8 = GDataTypeInfo[data_type].PrintFmt;
      }
      else if ((data_type == 4) && (iVar5 = strcmp(format,"%d"), iVar5 != 0)) {
        local_f8 = PatchFormatStringFloatToInt(format);
      }
      else {
        local_f8 = format;
      }
      bVar4 = ItemHoverable(&frame_bb,id);
      if ((((bVar4) && ((pIVar2->IO).MouseClicked[0] != false)) || (pIVar2->NavActivateId == id)) ||
         (pIVar2->NavActivateInputId == id)) {
        SetActiveID(id,this);
        SetFocusID(id,this);
        FocusWindow(this);
        *(byte *)&pIVar2->ActiveIdUsingNavDirMask = (byte)pIVar2->ActiveIdUsingNavDirMask | 0xc;
      }
      idx = 9;
      if (pIVar2->ActiveId != id) {
        idx = bVar4 + 7;
      }
      IVar6 = GetColorU32(idx,1.0);
      RenderNavHighlight(&frame_bb,id,1);
      IVar1.y = frame_bb.Min.y;
      IVar1.x = frame_bb.Min.x;
      p_max_00.y = frame_bb.Max.y;
      p_max_00.x = frame_bb.Max.x;
      RenderFrame(IVar1,p_max_00,IVar6,true,(pIVar2->Style).FrameRounding);
      grab_bb.Min.x = 0.0;
      grab_bb.Min.y = 0.0;
      grab_bb.Max.x = 0.0;
      grab_bb.Max.y = 0.0;
      bVar4 = SliderBehavior(&frame_bb,id,data_type,p_data,p_min,p_max,local_f8,flags | 0x100000,
                             &grab_bb);
      if (bVar4) {
        MarkItemEdited(id);
      }
      if (grab_bb.Min.y < grab_bb.Max.y) {
        this_00 = this->DrawList;
        IVar6 = GetColorU32((pIVar2->ActiveId == id) + 0x13,1.0);
        ImDrawList::AddRectFilled
                  (this_00,&grab_bb.Min,&grab_bb.Max,IVar6,(pIVar2->Style).GrabRounding,0);
      }
      iVar5 = DataTypeFormatString(value_buf,0x40,data_type,p_data,local_f8);
      local_90.y = frame_bb.Min.y + (pIVar2->Style).FramePadding.y;
      local_90.x = frame_bb.Min.x;
      local_98.x = 0.5;
      local_98.y = 0.0;
      RenderTextClipped(&local_90,&frame_bb.Max,value_buf,value_buf + iVar5,(ImVec2 *)0x0,&local_98,
                        (ImRect *)0x0);
      if (0.0 < fVar7) {
        pos.y = (pIVar2->Style).FramePadding.y + frame_bb.Min.y;
        pos.x = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
        RenderText(pos,label,(char *)0x0,true);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::VSliderScalar(const char* label, const ImVec2& size, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(frame_bb, id))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    const bool hovered = ItemHoverable(frame_bb, id);
    if ((hovered && g.IO.MouseClicked[0]) || g.NavActivateId == id || g.NavActivateInputId == id)
    {
        SetActiveID(id, window);
        SetFocusID(id, window);
        FocusWindow(window);
        g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, flags | ImGuiSliderFlags_Vertical, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.y > grab_bb.Min.y)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    // For the vertical slider we allow centered text to overlap the frame padding
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    return value_changed;
}